

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O1

void __thiscall chrono::fea::ChMesh::VariablesFbIncrementMq(ChMesh *this)

{
  element_type *peVar1;
  bool bVar2;
  pointer psVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar3 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vnodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      peVar1 = psVar3[uVar5].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)((long)&peVar1->_vptr_ChNodeFEAbase +
                            (long)peVar1->_vptr_ChNodeFEAbase[-3]) + 0x90))
                ((_func_int *)
                 ((long)&peVar1->_vptr_ChNodeFEAbase + (long)peVar1->_vptr_ChNodeFEAbase[-3]));
      psVar3 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->vnodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  psVar4 = (this->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->velements).
      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (*(psVar4[uVar5].super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChElementBase[0x14])();
      psVar4 = (this->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void ChMesh::VariablesFbIncrementMq() {
    // nodal masses
    for (unsigned int ie = 0; ie < vnodes.size(); ie++)
        vnodes[ie]->VariablesFbIncrementMq();

    // internal masses
    for (unsigned int ie = 0; ie < velements.size(); ie++)
        velements[ie]->VariablesFbIncrementMq();
}